

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

opStatus __thiscall
llvm::detail::DoubleAPFloat::multiply(DoubleAPFloat *this,DoubleAPFloat *RHS,roundingMode RM)

{
  bool bVar1;
  fltCategory fVar2;
  fltCategory fVar3;
  opStatus oVar4;
  opStatus oVar5;
  opStatus oVar6;
  opStatus oVar7;
  opStatus oVar8;
  opStatus oVar9;
  opStatus oVar10;
  DoubleAPFloat *RHS_00;
  undefined8 uVar11;
  APFloat U;
  APFloat T;
  APFloat C;
  APFloat Tau;
  APFloat D;
  APFloat W;
  APFloat B;
  APFloat A;
  undefined1 local_130 [8];
  Storage local_128;
  undefined1 local_110 [8];
  Storage local_108;
  undefined1 local_f0 [32];
  undefined1 local_d0 [32];
  undefined1 local_b0 [32];
  undefined1 local_90 [40];
  Storage local_68;
  Storage local_48;
  
  fVar2 = getCategory(this);
  RHS_00 = this;
  if ((fVar2 != fcNaN) && (fVar3 = getCategory(RHS), RHS_00 = RHS, fVar3 != fcNaN)) {
    if (fVar2 == fcInfinity) {
      RHS_00 = this;
      if (fVar3 == fcZero) {
LAB_00166822:
        makeNaN(this,false,false,(APInt *)0x0);
        return opOK;
      }
    }
    else if (fVar2 == fcZero) {
      RHS_00 = this;
      if (fVar3 == fcInfinity) goto LAB_00166822;
    }
    else if ((fVar3 != fcZero) && (fVar3 != fcInfinity)) {
      if ((fVar2 == fcNormal) && (fVar3 == fcNormal)) {
        APFloat::Storage::Storage
                  ((Storage *)&local_48.IEEE,
                   &((this->Floats)._M_t.
                     super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
                     super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl)->U);
        APFloat::Storage::Storage
                  ((Storage *)&local_68.IEEE,
                   &(this->Floats)._M_t.
                    super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t
                    .super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
                    super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl[1].U);
        APFloat::Storage::Storage
                  ((Storage *)(local_f0 + 8),
                   &((RHS->Floats)._M_t.
                     super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
                     super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl)->U);
        APFloat::Storage::Storage
                  ((Storage *)(local_b0 + 8),
                   &(RHS->Floats)._M_t.
                    super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t
                    .super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
                    super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl[1].U);
        APFloat::Storage::Storage((Storage *)&((Storage *)(local_110 + 8))->IEEE,&local_48);
        oVar4 = APFloat::multiply((APFloat *)local_110,(APFloat *)local_f0,RM);
        bVar1 = APFloat::isFiniteNonZero((APFloat *)local_110);
        if (bVar1) {
          APFloat::Storage::Storage((Storage *)(local_d0 + 8),&local_48);
          APFloat::changeSign((APFloat *)local_110);
          oVar5 = APFloat::fusedMultiplyAdd
                            ((APFloat *)local_d0,(APFloat *)local_f0,(APFloat *)local_110,RM);
          APFloat::changeSign((APFloat *)local_110);
          APFloat::Storage::Storage((Storage *)(local_130 + 8),&local_48);
          oVar6 = APFloat::multiply((APFloat *)local_130,(APFloat *)local_b0,RM);
          APFloat::Storage::Storage((Storage *)(local_90 + 8),&local_68);
          oVar7 = APFloat::multiply((APFloat *)local_90,(APFloat *)local_f0,RM);
          oVar8 = APFloat::add((APFloat *)local_130,(APFloat *)local_90,RM);
          oVar9 = APFloat::add((APFloat *)local_d0,(APFloat *)local_130,RM);
          APFloat::Storage::~Storage((Storage *)(local_90 + 8));
          APFloat::Storage::~Storage((Storage *)(local_130 + 8));
          APFloat::Storage::Storage((Storage *)(local_130 + 8),(Storage *)(local_110 + 8));
          oVar10 = APFloat::add((APFloat *)local_130,(APFloat *)local_d0,RM);
          APFloat::Storage::operator=
                    ((Storage *)
                     &(((this->Floats)._M_t.
                        super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>
                        .super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl)->U).IEEE,
                     (Storage *)(local_130 + 8));
          uVar11 = local_130;
          if (local_128.semantics == (fltSemantics *)semPPCDoubleDouble) {
            uVar11 = local_128.IEEE.significand;
          }
          oVar4 = oVar8 | oVar7 | oVar6 | oVar5 | oVar10 | oVar9 | oVar4;
          if ((*(byte *)(uVar11 + 0x1a) & 6) == 0) {
            APFloat::makeZero((this->Floats)._M_t.
                              super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>
                              .super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl + 1,false)
            ;
          }
          else {
            oVar5 = APFloat::subtract((APFloat *)local_110,(APFloat *)local_130,RM);
            oVar6 = APFloat::add((APFloat *)local_110,(APFloat *)local_d0,RM);
            oVar4 = oVar6 | oVar5 | oVar4;
            APFloat::Storage::operator=
                      ((Storage *)
                       &(this->Floats)._M_t.
                        super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>
                        .super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl[1].U.IEEE,
                       (Storage *)(local_110 + 8));
          }
          APFloat::Storage::~Storage((Storage *)(local_130 + 8));
          APFloat::Storage::~Storage((Storage *)(local_d0 + 8));
        }
        else {
          APFloat::Storage::operator=
                    ((Storage *)
                     &(((this->Floats)._M_t.
                        super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>
                        .super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl)->U).IEEE,
                     (Storage *)(local_110 + 8));
          APFloat::makeZero((this->Floats)._M_t.
                            super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>
                            .super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl + 1,false);
        }
        APFloat::Storage::~Storage((Storage *)(local_110 + 8));
        APFloat::Storage::~Storage((Storage *)(local_b0 + 8));
        APFloat::Storage::~Storage((Storage *)(local_f0 + 8));
        APFloat::Storage::~Storage((Storage *)&local_68.IEEE);
        APFloat::Storage::~Storage((Storage *)&local_48.IEEE);
        return oVar4;
      }
      __assert_fail("LHS.getCategory() == fcNormal && RHS.getCategory() == fcNormal && \"Special cases not handled exhaustively\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                    ,0xffc,
                    "APFloat::opStatus llvm::detail::DoubleAPFloat::multiply(const DoubleAPFloat &, APFloat::roundingMode)"
                   );
    }
  }
  operator=(this,RHS_00);
  return opOK;
}

Assistant:

APFloat::opStatus DoubleAPFloat::multiply(const DoubleAPFloat &RHS,
                                          APFloat::roundingMode RM) {
  const auto &LHS = *this;
  auto &Out = *this;
  /* Interesting observation: For special categories, finding the lowest
     common ancestor of the following layered graph gives the correct
     return category:

        NaN
       /   \
     Zero  Inf
       \   /
       Normal

     e.g. NaN * NaN = NaN
          Zero * Inf = NaN
          Normal * Zero = Zero
          Normal * Inf = Inf
  */
  if (LHS.getCategory() == fcNaN) {
    Out = LHS;
    return opOK;
  }
  if (RHS.getCategory() == fcNaN) {
    Out = RHS;
    return opOK;
  }
  if ((LHS.getCategory() == fcZero && RHS.getCategory() == fcInfinity) ||
      (LHS.getCategory() == fcInfinity && RHS.getCategory() == fcZero)) {
    Out.makeNaN(false, false, nullptr);
    return opOK;
  }
  if (LHS.getCategory() == fcZero || LHS.getCategory() == fcInfinity) {
    Out = LHS;
    return opOK;
  }
  if (RHS.getCategory() == fcZero || RHS.getCategory() == fcInfinity) {
    Out = RHS;
    return opOK;
  }
  assert(LHS.getCategory() == fcNormal && RHS.getCategory() == fcNormal &&
         "Special cases not handled exhaustively");

  int Status = opOK;
  APFloat A = Floats[0], B = Floats[1], C = RHS.Floats[0], D = RHS.Floats[1];
  // t = a * c
  APFloat T = A;
  Status |= T.multiply(C, RM);
  if (!T.isFiniteNonZero()) {
    Floats[0] = T;
    Floats[1].makeZero(/* Neg = */ false);
    return (opStatus)Status;
  }

  // tau = fmsub(a, c, t), that is -fmadd(-a, c, t).
  APFloat Tau = A;
  T.changeSign();
  Status |= Tau.fusedMultiplyAdd(C, T, RM);
  T.changeSign();
  {
    // v = a * d
    APFloat V = A;
    Status |= V.multiply(D, RM);
    // w = b * c
    APFloat W = B;
    Status |= W.multiply(C, RM);
    Status |= V.add(W, RM);
    // tau += v + w
    Status |= Tau.add(V, RM);
  }
  // u = t + tau
  APFloat U = T;
  Status |= U.add(Tau, RM);

  Floats[0] = U;
  if (!U.isFinite()) {
    Floats[1].makeZero(/* Neg = */ false);
  } else {
    // Floats[1] = (t - u) + tau
    Status |= T.subtract(U, RM);
    Status |= T.add(Tau, RM);
    Floats[1] = T;
  }
  return (opStatus)Status;
}